

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImGuiNextItemData *pIVar1;
  ImVector<float> *pIVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float *pfVar5;
  ImGuiContext *pIVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar9 = (pIVar4->DC).ItemWidthStack.Size;
  iVar3 = (pIVar4->DC).ItemWidthStack.Capacity;
  if (iVar9 == iVar3) {
    iVar9 = iVar9 + 1;
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar9 < iVar8) {
      iVar9 = iVar8;
    }
    if (iVar3 < iVar9) {
      pfVar7 = (float *)MemAlloc((long)iVar9 << 2);
      pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
      if (pfVar5 != (float *)0x0) {
        memcpy(pfVar7,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
        MemFree((pIVar4->DC).ItemWidthStack.Data);
      }
      (pIVar4->DC).ItemWidthStack.Data = pfVar7;
      (pIVar4->DC).ItemWidthStack.Capacity = iVar9;
    }
  }
  (pIVar4->DC).ItemWidthStack.Data[(pIVar4->DC).ItemWidthStack.Size] = (pIVar4->DC).ItemWidth;
  pIVar2 = &(pIVar4->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  fVar10 = w_full - (float)(components + -1) * (pIVar6->Style).ItemInnerSpacing.x;
  fVar11 = fVar10;
  if (1 < components) {
    fVar12 = (float)components;
    fVar13 = fVar10;
    do {
      components = components + -1;
      fVar11 = (float)(int)(((float)components * fVar10) / fVar12);
      fVar13 = fVar13 - fVar11;
      if (fVar13 <= 1.0) {
        fVar13 = 1.0;
      }
      iVar9 = (pIVar4->DC).ItemWidthStack.Size;
      iVar3 = (pIVar4->DC).ItemWidthStack.Capacity;
      if (iVar9 == iVar3) {
        if (iVar3 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar3 / 2 + iVar3;
        }
        iVar9 = iVar9 + 1;
        if (iVar9 < iVar8) {
          iVar9 = iVar8;
        }
        if (iVar3 < iVar9) {
          pfVar7 = (float *)MemAlloc((long)iVar9 << 2);
          pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
          if (pfVar5 != (float *)0x0) {
            memcpy(pfVar7,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
            MemFree((pIVar4->DC).ItemWidthStack.Data);
          }
          (pIVar4->DC).ItemWidthStack.Data = pfVar7;
          (pIVar4->DC).ItemWidthStack.Capacity = iVar9;
        }
      }
      (pIVar4->DC).ItemWidthStack.Data[(pIVar4->DC).ItemWidthStack.Size] = fVar13;
      pIVar2 = &(pIVar4->DC).ItemWidthStack;
      pIVar2->Size = pIVar2->Size + 1;
      fVar13 = fVar11;
    } while (1 < components);
  }
  if (fVar11 <= 1.0) {
    fVar11 = 1.0;
  }
  (pIVar4->DC).ItemWidth = fVar11;
  pIVar1 = &pIVar6->NextItemData;
  *(byte *)&pIVar1->Flags = (byte)pIVar1->Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(components > 0);
    const ImGuiStyle& style = g.Style;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    float w_items = w_full - style.ItemInnerSpacing.x * (components - 1);
    float prev_split = w_items;
    for (int i = components - 1; i > 0; i--)
    {
        float next_split = IM_TRUNC(w_items * i / components);
        window->DC.ItemWidthStack.push_back(ImMax(prev_split - next_split, 1.0f));
        prev_split = next_split;
    }
    window->DC.ItemWidth = ImMax(prev_split, 1.0f);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}